

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JFSON.h
# Opt level: O0

Json * __thiscall JFSON::Json::dump_abi_cxx11_(Json *this)

{
  Json *in_RSI;
  Json *this_local;
  string *out;
  
  std::__cxx11::string::string((string *)this);
  dump(in_RSI,(string *)this);
  return this;
}

Assistant:

std::string dump() const {
        std::string out;
        dump(out);
        return out;
    }